

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Operation.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Operation::ArchiveOUT(ChFunction_Operation *this,ChArchiveOut *marchive)

{
  eChOperation_mapper mmapper;
  ChEnumMapper<chrono::ChFunction_Operation::eChOperation> local_b0;
  ChEnumMapper<chrono::ChFunction_Operation::eChOperation> local_90;
  ChNameValue<chrono::ChEnumMapper<chrono::ChFunction_Operation::eChOperation>_> local_70;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_58;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_40;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Operation>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_40._value = &this->fa;
  local_40._name = "fa";
  local_40._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_40);
  local_58._value = &this->fb;
  local_58._name = "fb";
  local_58._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_58);
  eChOperation_mapper::eChOperation_mapper((eChOperation_mapper *)&local_90);
  eChOperation_mapper::operator()(&local_b0,(eChOperation_mapper *)&local_90,&this->op_type);
  local_70._name = "operation_type";
  local_70._flags = '\0';
  local_70._value = &local_b0;
  ChArchiveOut::operator<<(marchive,&local_70);
  ChEnumMapper<chrono::ChFunction_Operation::eChOperation>::~ChEnumMapper(&local_b0);
  ChEnumMapper<chrono::ChFunction_Operation::eChOperation>::~ChEnumMapper(&local_90);
  return;
}

Assistant:

void ChFunction_Operation::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Operation>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(fa);
    marchive << CHNVP(fb);
    eChOperation_mapper mmapper;
    marchive << CHNVP(mmapper(op_type), "operation_type");
}